

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O2

void __thiscall QHttpNetworkRequest::setPriority(QHttpNetworkRequest *this,Priority priority)

{
  QHttpNetworkRequestPrivate *pQVar1;
  
  pQVar1 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->(&this->d);
  pQVar1->priority = priority;
  return;
}

Assistant:

void QHttpNetworkRequest::setPriority(Priority priority)
{
    d->priority = priority;
}